

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

bool __thiscall
tinygltf::TinyGLTF::WriteGltfSceneToFile
          (TinyGLTF *this,Model *model,string *filename,bool embedImages,bool embedBuffers,
          bool prettyPrint,bool writeBinary)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer pcVar3;
  undefined8 uVar4;
  uint uVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long *plVar11;
  ulong uVar12;
  size_type *psVar13;
  pointer pBVar14;
  ulong uVar15;
  uint __len;
  pointer pbVar16;
  string *psVar17;
  pointer pbVar18;
  uint __val;
  string binSavePath;
  json buffer;
  string binFilename;
  JsonDocument output;
  string binUri;
  string *local_338;
  long local_330;
  undefined1 local_328 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usedFilenames;
  json buffers;
  string __str;
  string defaultBinFileExt;
  string defaultBinFilename;
  vector<unsigned_char,_std::allocator<unsigned_char>_> binBuffer;
  string baseDir;
  string uri;
  ios_base local_138 [264];
  
  output.m_type = null;
  output.m_value.object = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&output,true);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&output,true);
  GetBaseFilename(&defaultBinFilename,filename);
  defaultBinFileExt._M_dataplus._M_p = (pointer)&defaultBinFileExt.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&defaultBinFileExt,".bin","");
  lVar10 = std::__cxx11::string::rfind((char)&defaultBinFilename,0x2e);
  if (lVar10 != -1) {
    std::__cxx11::string::substr((ulong)&uri,(ulong)&defaultBinFilename);
    std::__cxx11::string::operator=((string *)&defaultBinFilename,(string *)&uri);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uri._M_dataplus._M_p != &uri.field_2) {
      operator_delete(uri._M_dataplus._M_p);
    }
  }
  GetBaseDir(&baseDir,filename);
  if (baseDir._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&baseDir,0,(char *)0x0,0x1613d0);
  }
  SerializeGltfModel(model,&output);
  usedFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  usedFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  usedFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  binBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((model->buffers).super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (model->buffers).super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    buffers.m_type = null;
    buffers.m_value.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&buffers,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&buffers,true);
    uVar4 = _memcpy;
    pcVar3 = _VTT;
    if ((model->buffers).super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (model->buffers).super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar15 = 0;
      do {
        buffer.m_type = null;
        buffer.m_value.object = (object_t *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&buffer,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&buffer,true);
        if ((int)uVar15 == 0 && writeBinary) {
          pBVar14 = (model->buffers).
                    super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (pBVar14[uVar15].uri._M_string_length != 0) goto LAB_00125a23;
          SerializeGltfBufferBin(pBVar14 + uVar15,&buffer,&binBuffer);
        }
        else {
LAB_00125a23:
          if (!embedBuffers) {
            binSavePath._M_string_length = 0;
            binSavePath.field_2._M_local_buf[0] = '\0';
            binFilename._M_dataplus._M_p = (pointer)&binFilename.field_2;
            binFilename._M_string_length = 0;
            binFilename.field_2._M_local_buf[0] = '\0';
            binUri._M_dataplus._M_p = (pointer)&binUri.field_2;
            binUri._M_string_length = 0;
            binUri.field_2._M_local_buf[0] = '\0';
            pBVar14 = (model->buffers).
                      super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            binSavePath._M_dataplus._M_p = (pointer)&binSavePath.field_2;
            if ((pBVar14[uVar15].uri._M_string_length == 0) ||
               (bVar6 = IsDataURI(&pBVar14[uVar15].uri), bVar6)) {
              std::operator+(&uri,&defaultBinFilename,&defaultBinFileExt);
              std::__cxx11::string::operator=((string *)&binFilename,(string *)&uri);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)uri._M_dataplus._M_p != &uri.field_2) {
                operator_delete(uri._M_dataplus._M_p);
              }
              if (usedFilenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  usedFilenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                __val = 0;
                pbVar16 = usedFilenames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pbVar18 = usedFilenames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                do {
                  iVar8 = std::__cxx11::string::compare((string *)&binFilename);
                  if (iVar8 == 0) {
                    __len = 1;
                    if (9 < __val) {
                      uVar12 = (ulong)__val;
                      uVar5 = 4;
                      do {
                        __len = uVar5;
                        uVar9 = (uint)uVar12;
                        if (uVar9 < 100) {
                          __len = __len - 2;
                          goto LAB_00125b77;
                        }
                        if (uVar9 < 1000) {
                          __len = __len - 1;
                          goto LAB_00125b77;
                        }
                        if (uVar9 < 10000) goto LAB_00125b77;
                        uVar12 = uVar12 / 10000;
                        uVar5 = __len + 4;
                      } while (99999 < uVar9);
                      __len = __len + 1;
                    }
LAB_00125b77:
                    __str._M_dataplus._M_p = (pointer)&__str.field_2;
                    std::__cxx11::string::_M_construct((ulong)&__str,(char)__len);
                    std::__detail::__to_chars_10_impl<unsigned_int>
                              (__str._M_dataplus._M_p,__len,__val);
                    plVar11 = (long *)std::__cxx11::string::replace
                                                ((ulong)&__str,0,(char *)0x0,
                                                 (ulong)defaultBinFilename._M_dataplus._M_p);
                    local_338 = (string *)local_328;
                    psVar17 = (string *)(plVar11 + 2);
                    if ((string *)*plVar11 == psVar17) {
                      local_328._0_8_ = (psVar17->_M_dataplus)._M_p;
                      local_328._8_8_ = plVar11[3];
                    }
                    else {
                      local_328._0_8_ = (psVar17->_M_dataplus)._M_p;
                      local_338 = (string *)*plVar11;
                    }
                    local_330 = plVar11[1];
                    *plVar11 = (long)psVar17;
                    plVar11[1] = 0;
                    *(undefined1 *)(plVar11 + 2) = 0;
                    plVar11 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_338,
                                                 (ulong)defaultBinFileExt._M_dataplus._M_p);
                    psVar13 = (size_type *)(plVar11 + 2);
                    if ((size_type *)*plVar11 == psVar13) {
                      uri.field_2._M_allocated_capacity = *psVar13;
                      uri.field_2._8_8_ = plVar11[3];
                      uri._M_dataplus._M_p = (pointer)&uri.field_2;
                    }
                    else {
                      uri.field_2._M_allocated_capacity = *psVar13;
                      uri._M_dataplus._M_p = (pointer)*plVar11;
                    }
                    uri._M_string_length = plVar11[1];
                    *plVar11 = (long)psVar13;
                    plVar11[1] = 0;
                    *(undefined1 *)(plVar11 + 2) = 0;
                    std::__cxx11::string::operator=((string *)&binFilename,(string *)&uri);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)uri._M_dataplus._M_p != &uri.field_2) {
                      operator_delete(uri._M_dataplus._M_p);
                    }
                    if (local_338 != (string *)local_328) {
                      operator_delete(local_338);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)__str._M_dataplus._M_p != &__str.field_2) {
                      operator_delete(__str._M_dataplus._M_p);
                    }
                    __val = __val + 1;
                    pbVar16 = usedFilenames.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pbVar18 = usedFilenames.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                  else {
                    pbVar16 = pbVar16 + 1;
                  }
                } while (pbVar16 != pbVar18);
              }
              if ((this->uri_cb).encode.super__Function_base._M_manager == (_Manager_type)0x0) {
                std::__cxx11::string::_M_assign((string *)&binUri);
              }
              else {
                uri._M_dataplus._M_p = (pointer)&uri.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&uri,"buffer","");
                __str._M_dataplus._M_p = (pointer)(this->uri_cb).user_data;
                local_338 = &binUri;
                if ((this->uri_cb).encode.super__Function_base._M_manager == (_Manager_type)0x0) {
                  std::__throw_bad_function_call();
                }
                bVar6 = (*(this->uri_cb).encode._M_invoker)
                                  ((_Any_data *)&this->uri_cb,&binFilename,&uri,&local_338,
                                   (void **)&__str);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)uri._M_dataplus._M_p != &uri.field_2) {
                  operator_delete(uri._M_dataplus._M_p);
                }
                if (!bVar6) goto LAB_001264e5;
              }
LAB_00125e88:
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&usedFilenames,&binFilename);
              JoinPath(&uri,&baseDir,&binFilename);
              std::__cxx11::string::operator=((string *)&binSavePath,(string *)&uri);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)uri._M_dataplus._M_p != &uri.field_2) {
                operator_delete(uri._M_dataplus._M_p);
              }
              pBVar14 = (model->buffers).
                        super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar15;
              std::ofstream::ofstream(&uri,binSavePath._M_dataplus._M_p,_S_bin);
              cVar7 = std::__basic_file<char>::is_open();
              if (cVar7 == '\0') {
                uri._M_dataplus._M_p = pcVar3;
                *(undefined8 *)((long)&uri._M_dataplus._M_p + *(long *)(pcVar3 + -0x18)) = uVar4;
                std::filebuf::~filebuf((filebuf *)&uri._M_string_length);
                std::ios_base::~ios_base(local_138);
              }
              else {
                puVar2 = (pBVar14->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((pBVar14->data).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish != puVar2) {
                  std::ostream::write((char *)&uri,(long)puVar2);
                }
                uri._M_dataplus._M_p = pcVar3;
                *(undefined8 *)((long)&uri._M_dataplus._M_p + *(long *)(pcVar3 + -0x18)) = uVar4;
                std::filebuf::~filebuf((filebuf *)&uri._M_string_length);
                std::ios_base::~ios_base(local_138);
                paVar1 = &uri.field_2;
                uri.field_2._M_allocated_capacity = 0x676e654c65747962;
                uri._M_string_length = 10;
                uri.field_2._8_3_ = 0x6874;
                uri._M_dataplus._M_p = (pointer)paVar1;
                SerializeNumberProperty<unsigned_long>
                          ((string *)paVar1,
                           (long)(pBVar14->data).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           *(long *)&(pBVar14->data).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data,&buffer);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)uri._M_dataplus._M_p != paVar1) {
                  operator_delete(uri._M_dataplus._M_p);
                }
                paVar1 = &uri.field_2;
                uri._M_string_length = 3;
                uri.field_2._M_allocated_capacity._0_4_ = 0x697275;
                uri._M_dataplus._M_p = (pointer)paVar1;
                SerializeStringProperty((string *)paVar1,(string *)binUri._M_dataplus._M_p,&buffer);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)uri._M_dataplus._M_p != paVar1) {
                  operator_delete(uri._M_dataplus._M_p);
                }
                if ((pBVar14->name)._M_string_length != 0) {
                  paVar1 = &uri.field_2;
                  uri._M_string_length = 4;
                  uri.field_2._M_allocated_capacity._0_5_ = 0x656d616e;
                  uri._M_dataplus._M_p = (pointer)paVar1;
                  SerializeStringProperty
                            ((string *)paVar1,(string *)(pBVar14->name)._M_dataplus._M_p,&buffer);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)uri._M_dataplus._M_p != paVar1) {
                    operator_delete(uri._M_dataplus._M_p);
                  }
                }
                SerializeExtensionMap(&pBVar14->extensions,&buffer);
                SerializeExtras(&pBVar14->extras,&buffer);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)binUri._M_dataplus._M_p != &binUri.field_2) {
                operator_delete(binUri._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)binFilename._M_dataplus._M_p != &binFilename.field_2) {
                operator_delete(binFilename._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)binSavePath._M_dataplus._M_p != &binSavePath.field_2) {
                operator_delete(binSavePath._M_dataplus._M_p);
              }
              if (cVar7 != '\0') goto LAB_0012611a;
            }
            else {
              std::__cxx11::string::_M_assign((string *)&binUri);
              local_338 = (string *)(this->uri_cb).user_data;
              uri._M_dataplus._M_p = (pointer)&binFilename;
              if ((this->uri_cb).decode.super__Function_base._M_manager == (_Manager_type)0x0) {
                std::__throw_bad_function_call();
              }
              bVar6 = (*(this->uri_cb).decode._M_invoker)
                                ((_Any_data *)&(this->uri_cb).decode,&binUri,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  **)&uri,&local_338);
              if (bVar6) goto LAB_00125e88;
LAB_001264e5:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)binUri._M_dataplus._M_p != &binUri.field_2) {
                operator_delete(binUri._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)binFilename._M_dataplus._M_p != &binFilename.field_2) {
                operator_delete(binFilename._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)binSavePath._M_dataplus._M_p != &binSavePath.field_2) {
                operator_delete(binSavePath._M_dataplus._M_p);
              }
            }
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json(&buffer);
            psVar17 = (string *)&buffers;
            goto LAB_00126534;
          }
          SerializeGltfBuffer((model->buffers).
                              super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar15,&buffer);
        }
LAB_0012611a:
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back(&buffers,&buffer);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&buffer);
        uVar15 = (ulong)((int)uVar15 + 1);
        uVar12 = ((long)(model->buffers).
                        super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(model->buffers).
                        super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 5) * 0x2e8ba2e8ba2e8ba3;
      } while (uVar15 <= uVar12 && uVar12 - uVar15 != 0);
    }
    detail::JsonAddMember(&output,"buffers",&buffers);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&buffers);
  }
  if ((model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
      super__Vector_impl_data._M_start) {
    binSavePath._M_dataplus._M_p = binSavePath._M_dataplus._M_p & 0xffffffffffffff00;
    binSavePath._M_string_length = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&binSavePath,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&binSavePath,true);
    if ((model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar15 = 0;
      do {
        binFilename._M_dataplus._M_p = binFilename._M_dataplus._M_p & 0xffffffffffffff00;
        binFilename._M_string_length = 0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&binFilename,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&binFilename,true);
        uri._M_dataplus._M_p = (pointer)&uri.field_2;
        uri._M_string_length = 0;
        uri.field_2._M_allocated_capacity = uri.field_2._M_allocated_capacity & 0xffffffffffffff00;
        bVar6 = UpdateImageObject((model->images).
                                  super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar15,&baseDir,
                                  (int)uVar15,embedImages,&this->fs,&this->uri_cb,
                                  &this->WriteImageData,this->write_image_user_data_,&uri);
        if (!bVar6) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uri._M_dataplus._M_p != &uri.field_2) {
            operator_delete(uri._M_dataplus._M_p);
          }
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&binFilename);
          psVar17 = &binSavePath;
LAB_00126534:
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)psVar17);
          bVar6 = false;
          goto LAB_0012653b;
        }
        SerializeGltfImage((model->images).
                           super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar15,&uri,
                           (json *)&binFilename);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&binSavePath,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&binFilename);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uri._M_dataplus._M_p != &uri.field_2) {
          operator_delete(uri._M_dataplus._M_p);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&binFilename);
        uVar15 = (ulong)((int)uVar15 + 1);
        uVar12 = ((long)(model->images).
                        super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(model->images).
                        super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * 0x21cfb2b78c13521d;
      } while (uVar15 <= uVar12 && uVar12 - uVar15 != 0);
    }
    detail::JsonAddMember(&output,"images",(json *)&binSavePath);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&binSavePath);
  }
  if (writeBinary) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::dump(&binSavePath,&output,-1,' ',false,strict);
    std::ofstream::ofstream(&uri,(filename->_M_dataplus)._M_p,_S_bin);
    bVar6 = WriteBinaryGltfStream((ostream *)&uri,&binSavePath,&binBuffer);
    uri._M_dataplus._M_p = _VTT;
    *(undefined8 *)((long)&uri._M_dataplus._M_p + *(long *)(_VTT + -0x18)) = _memcpy;
    std::filebuf::~filebuf((filebuf *)&uri._M_string_length);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)binSavePath._M_dataplus._M_p == &binSavePath.field_2) goto LAB_0012653b;
  }
  else {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::dump(&binSavePath,&output,prettyPrint - 1 | 2,' ',false,strict);
    std::ofstream::ofstream(&uri,(filename->_M_dataplus)._M_p,_S_out);
    cVar7 = std::__basic_file<char>::is_open();
    if (cVar7 == '\0') {
      bVar6 = false;
    }
    else {
      bVar6 = WriteGltfStream((ostream *)&uri,(string *)binSavePath._M_dataplus._M_p);
    }
    uri._M_dataplus._M_p = _VTT;
    *(undefined8 *)((long)&uri._M_dataplus._M_p + *(long *)(_VTT + -0x18)) = _memcpy;
    std::filebuf::~filebuf((filebuf *)&uri._M_string_length);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)binSavePath._M_dataplus._M_p == &binSavePath.field_2) goto LAB_0012653b;
  }
  operator_delete(binSavePath._M_dataplus._M_p);
LAB_0012653b:
  if (binBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(binBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&usedFilenames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)baseDir._M_dataplus._M_p != &baseDir.field_2) {
    operator_delete(baseDir._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)defaultBinFileExt._M_dataplus._M_p != &defaultBinFileExt.field_2) {
    operator_delete(defaultBinFileExt._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)defaultBinFilename._M_dataplus._M_p != &defaultBinFilename.field_2) {
    operator_delete(defaultBinFilename._M_dataplus._M_p);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&output);
  return bVar6;
}

Assistant:

bool TinyGLTF::WriteGltfSceneToFile(const Model *model,
                                    const std::string &filename,
                                    bool embedImages = false,
                                    bool embedBuffers = false,
                                    bool prettyPrint = true,
                                    bool writeBinary = false) {
  detail::JsonDocument output;
  std::string defaultBinFilename = GetBaseFilename(filename);
  std::string defaultBinFileExt = ".bin";
  std::string::size_type pos =
      defaultBinFilename.rfind('.', defaultBinFilename.length());

  if (pos != std::string::npos) {
    defaultBinFilename = defaultBinFilename.substr(0, pos);
  }
  std::string baseDir = GetBaseDir(filename);
  if (baseDir.empty()) {
    baseDir = "./";
  }
  /// Serialize all properties except buffers and images.
  SerializeGltfModel(model, output);

  // BUFFERS
  std::vector<std::string> usedFilenames;
  std::vector<unsigned char> binBuffer;
  if (model->buffers.size()) {
    detail::json buffers;
    detail::JsonReserveArray(buffers, model->buffers.size());
    for (unsigned int i = 0; i < model->buffers.size(); ++i) {
      detail::json buffer;
      if (writeBinary && i == 0 && model->buffers[i].uri.empty()) {
        SerializeGltfBufferBin(model->buffers[i], buffer, binBuffer);
      } else if (embedBuffers) {
        SerializeGltfBuffer(model->buffers[i], buffer);
      } else {
        std::string binSavePath;
        std::string binFilename;
        std::string binUri;
        if (!model->buffers[i].uri.empty() &&
            !IsDataURI(model->buffers[i].uri)) {
          binUri = model->buffers[i].uri;
          if (!uri_cb.decode(binUri, &binFilename, uri_cb.user_data)) {
            return false;
          }
        } else {
          binFilename = defaultBinFilename + defaultBinFileExt;
          bool inUse = true;
          int numUsed = 0;
          while (inUse) {
            inUse = false;
            for (const std::string &usedName : usedFilenames) {
              if (binFilename.compare(usedName) != 0) continue;
              inUse = true;
              binFilename = defaultBinFilename + std::to_string(numUsed++) +
                            defaultBinFileExt;
              break;
            }
          }

          if (uri_cb.encode) {
            if (!uri_cb.encode(binFilename, "buffer", &binUri,
                               uri_cb.user_data)) {
              return false;
            }
          } else {
            binUri = binFilename;
          }
        }
        usedFilenames.push_back(binFilename);
        binSavePath = JoinPath(baseDir, binFilename);
        if (!SerializeGltfBuffer(model->buffers[i], buffer, binSavePath,
                                 binUri)) {
          return false;
        }
      }
      detail::JsonPushBack(buffers, std::move(buffer));
    }
    detail::JsonAddMember(output, "buffers", std::move(buffers));
  }

  // IMAGES
  if (model->images.size()) {
    detail::json images;
    detail::JsonReserveArray(images, model->images.size());
    for (unsigned int i = 0; i < model->images.size(); ++i) {
      detail::json image;

      std::string uri;
      if (!UpdateImageObject(model->images[i], baseDir, int(i), embedImages,
                             &fs, &uri_cb, this->WriteImageData,
                             this->write_image_user_data_, &uri)) {
        return false;
      }
      SerializeGltfImage(model->images[i], uri, image);
      detail::JsonPushBack(images, std::move(image));
    }
    detail::JsonAddMember(output, "images", std::move(images));
  }

  if (writeBinary) {
    return WriteBinaryGltfFile(filename, detail::JsonToString(output),
                               binBuffer);
  } else {
    return WriteGltfFile(filename,
                         detail::JsonToString(output, (prettyPrint ? 2 : -1)));
  }
}